

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

void __thiscall
brotli::Hashers::WarmupHash<brotli::HashLongestMatch<15,6,10>>
          (Hashers *this,size_t size,uint8_t *dict,HashLongestMatch<15,_6,_10> *hasher)

{
  long local_30;
  size_t i;
  HashLongestMatch<15,_6,_10> *hasher_local;
  uint8_t *dict_local;
  size_t size_local;
  Hashers *this_local;
  
  HashLongestMatch<15,_6,_10>::Init(hasher);
  for (local_30 = 0; local_30 + 3U < size; local_30 = local_30 + 1) {
    HashLongestMatch<15,_6,_10>::Store(hasher,dict + local_30,(uint32_t)local_30);
  }
  return;
}

Assistant:

void WarmupHash(const size_t size, const uint8_t* dict, Hasher* hasher) {
    hasher->Init();
    for (size_t i = 0; i + Hasher::kHashTypeLength - 1 < size; i++) {
      hasher->Store(&dict[i], static_cast<uint32_t>(i));
    }
  }